

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

EOPLL_RateConv * EOPLL_RateConv_new(double f_inp,double f_out,int ch)

{
  EOPLL_RateConv *pEVar1;
  int32_t **ppiVar2;
  int32_t *piVar3;
  int16_t *piVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pEVar1 = (EOPLL_RateConv *)malloc(0x28);
  pEVar1->ch = ch;
  dVar7 = f_inp / f_out;
  pEVar1->f_ratio = dVar7;
  ppiVar2 = (int32_t **)malloc((long)ch * 8);
  pEVar1->buf = ppiVar2;
  if (0 < ch) {
    uVar5 = 0;
    do {
      piVar3 = (int32_t *)malloc(0x40);
      ppiVar2[uVar5] = piVar3;
      uVar5 = uVar5 + 1;
    } while ((uint)ch != uVar5);
  }
  piVar4 = (int16_t *)malloc(0x1000);
  pEVar1->sinc_table = piVar4;
  lVar6 = 0;
  do {
    dVar10 = (double)(int)lVar6 * 0.00390625;
    if (f_inp <= f_out) {
      dVar11 = dVar10 * 0.5 * 0.125 + 0.5;
      dVar8 = cos(dVar11 * 6.283185307179586);
      dVar11 = cos(dVar11 * 12.566370614359172);
      dVar9 = 1.0;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar9 = sin(dVar10 * 3.141592653589793);
        dVar9 = dVar9 / (dVar10 * 3.141592653589793);
      }
      dVar10 = (dVar11 * 0.08 + dVar8 * -0.5 + 0.42) * dVar9 * 4096.0;
    }
    else {
      dVar10 = dVar10 / dVar7;
      dVar11 = dVar10 * 0.5 * 0.125 + 0.5;
      dVar8 = cos(dVar11 * 6.283185307179586);
      dVar11 = cos(dVar11 * 12.566370614359172);
      dVar9 = 1.0;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar9 = sin(dVar10 * 3.141592653589793);
        dVar9 = dVar9 / (dVar10 * 3.141592653589793);
      }
      dVar10 = ((dVar11 * 0.08 + dVar8 * -0.5 + 0.42) * dVar9 * 4096.0) / dVar7;
    }
    piVar4[lVar6] = (int16_t)(int)dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x800);
  return pEVar1;
}

Assistant:

EOPLL_RateConv *EOPLL_RateConv_new(double f_inp, double f_out, int ch) {
  EOPLL_RateConv *conv = malloc(sizeof(EOPLL_RateConv));
  int i;

  conv->ch = ch;
  conv->f_ratio = f_inp / f_out;
  conv->buf = malloc(sizeof(void *) * ch);
  for (i = 0; i < ch; i++) {
    conv->buf[i] = malloc(sizeof(conv->buf[0][0]) * LW);
  }

  /* create sinc_table for positive 0 <= x < LW/2 */
  conv->sinc_table = malloc(sizeof(conv->sinc_table[0]) * SINC_RESO * LW / 2);
  for (i = 0; i < SINC_RESO * LW / 2; i++) {
    const double x = (double)i / SINC_RESO;
    if (f_out < f_inp) {
      /* for downsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x / conv->f_ratio) / conv->f_ratio);
    } else {
      /* for upsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x));
    }
  }

  return conv;
}